

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_auth_keyboard_info_request.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int local_1c;
  int local_18;
  int malloc_call_num;
  int tc;
  int i;
  int ret;
  
  i = 0;
  tc = 0;
  for (malloc_call_num = 0; malloc_call_num < 0x10; malloc_call_num = malloc_call_num + 1) {
    iVar1 = test_case(malloc_call_num + 1,test_cases[malloc_call_num].data,
                      test_cases[malloc_call_num].data_len,(void *)0x0,
                      test_cases[malloc_call_num].expected);
    if (iVar1 != 0) {
      tc = 1;
    }
  }
  for (malloc_call_num = 0; malloc_call_num < 2; malloc_call_num = malloc_call_num + 1) {
    local_18 = malloc_call_num + 0x11;
    local_1c = malloc_call_num + 3;
    iVar1 = test_case(local_18,failed_malloc_test_cases[malloc_call_num].data,
                      failed_malloc_test_cases[malloc_call_num].data_len,&local_1c,
                      failed_malloc_test_cases[malloc_call_num].expected);
    if (iVar1 != 0) {
      tc = 1;
    }
  }
  return tc;
}

Assistant:

int main(void)
{
    int ret = 0;
    int i;

    for(i = 0; i < TEST_CASES_LEN; i++) {
        if(test_case(i + 1,
                     test_cases[i].data,
                     test_cases[i].data_len,
                     NULL,
                     test_cases[i].expected))
            ret = 1;
    }

    for(i = 0; i < FAILED_MALLOC_TEST_CASES_LEN; i++) {
        int tc =  i + TEST_CASES_LEN + 1;
        int malloc_call_num = 3 + i;
        if(test_case(tc,
                     failed_malloc_test_cases[i].data,
                     failed_malloc_test_cases[i].data_len,
                     &malloc_call_num,
                     failed_malloc_test_cases[i].expected))
            ret = 1;
    }

    return ret;
}